

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O1

int Extra_FileIsType(char *pFileName,char *pS1,char *pS2,char *pS3)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  
  sVar2 = strlen(pFileName);
  if (pS1 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    sVar3 = strlen(pS1);
    iVar1 = (int)sVar3;
  }
  iVar4 = (int)sVar2;
  if (iVar1 < iVar4 && iVar1 != 0) {
    iVar1 = strncmp(pFileName + ((long)iVar4 - (long)iVar1),pS1,(long)iVar1);
    if (iVar1 != 0) goto LAB_00415c61;
LAB_00415cde:
    iVar1 = 1;
  }
  else {
LAB_00415c61:
    if (pS2 == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      sVar2 = strlen(pS2);
      iVar1 = (int)sVar2;
    }
    if (iVar1 < iVar4 && iVar1 != 0) {
      iVar1 = strncmp(pFileName + ((long)iVar4 - (long)iVar1),pS2,(long)iVar1);
      if (iVar1 == 0) goto LAB_00415cde;
    }
    if (pS3 == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      sVar2 = strlen(pS3);
      iVar1 = (int)sVar2;
    }
    if (iVar1 < iVar4 && iVar1 != 0) {
      iVar1 = strncmp(pFileName + ((long)iVar4 - (long)iVar1),pS3,(long)iVar1);
      if (iVar1 == 0) goto LAB_00415cde;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Extra_FileIsType( char * pFileName, char * pS1, char * pS2, char * pS3 )
{
    int lenS, lenF = strlen(pFileName);
    lenS = pS1 ? strlen(pS1) : 0;
    if ( lenS && lenF > lenS && !strncmp( pFileName+lenF-lenS, pS1, lenS ) )
        return 1;
    lenS = pS2 ? strlen(pS2) : 0;
    if ( lenS && lenF > lenS && !strncmp( pFileName+lenF-lenS, pS2, lenS ) )
        return 1;
    lenS = pS3 ? strlen(pS3) : 0;
    if ( lenS && lenF > lenS && !strncmp( pFileName+lenF-lenS, pS3, lenS ) )
        return 1;
    return 0;
}